

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

void __thiscall
ymfm::fm_operator<ymfm::opn_registers_base<false>_>::clock_ssg_eg_state
          (fm_operator<ymfm::opn_registers_base<false>_> *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint16_t uVar3;
  uint32_t mode;
  fm_operator<ymfm::opn_registers_base<false>_> *this_local;
  
  uVar1 = bitfield((uint)this->m_env_attenuation,9,1);
  if (uVar1 != 0) {
    uVar1 = opn_registers_base<false>::op_ssg_eg_mode(this->m_regs,this->m_opoffs);
    uVar2 = bitfield(uVar1,0,1);
    if (uVar2 == 0) {
      uVar2 = bitfield(uVar1,1,1);
      this->m_ssg_inverted = this->m_ssg_inverted ^ (byte)uVar2;
      if ((this->m_env_state == EG_DECAY) || (this->m_env_state == EG_SUSTAIN)) {
        start_attack(this,true);
      }
      uVar1 = bitfield(uVar1,1,1);
      if (uVar1 == 0) {
        this->m_phase = 0;
      }
    }
    else {
      uVar2 = bitfield(uVar1,2,1);
      uVar1 = bitfield(uVar1,1,1);
      this->m_ssg_inverted = (byte)uVar2 ^ (byte)uVar1;
      if (this->m_env_state != EG_ATTACK) {
        uVar3 = 0x3ff;
        if (this->m_ssg_inverted != '\0') {
          uVar3 = 0x200;
        }
        this->m_env_attenuation = uVar3;
      }
    }
    if (this->m_env_state == EG_RELEASE) {
      this->m_env_attenuation = 0x3ff;
    }
  }
  return;
}

Assistant:

void fm_operator<RegisterType>::clock_ssg_eg_state()
{
	// work only happens once the attenuation crosses above 0x200
	if (!bitfield(m_env_attenuation, 9))
		return;

	// 8 SSG-EG modes:
	//    000: repeat normally
	//    001: run once, hold low
	//    010: repeat, alternating between inverted/non-inverted
	//    011: run once, hold high
	//    100: inverted repeat normally
	//    101: inverted run once, hold low
	//    110: inverted repeat, alternating between inverted/non-inverted
	//    111: inverted run once, hold high
	uint32_t mode = m_regs.op_ssg_eg_mode(m_opoffs);

	// hold modes (1/3/5/7)
	if (bitfield(mode, 0))
	{
		// set the inverted flag to the end state (0 for modes 1/7, 1 for modes 3/5)
		m_ssg_inverted = bitfield(mode, 2) ^ bitfield(mode, 1);

		// if holding, force the attenuation to the expected value once we're
		// past the attack phase
		if (m_env_state != EG_ATTACK)
			m_env_attenuation = m_ssg_inverted ? 0x200 : 0x3ff;
	}

	// continuous modes (0/2/4/6)
	else
	{
		// toggle invert in alternating mode (even in attack state)
		m_ssg_inverted ^= bitfield(mode, 1);

		// restart attack if in decay/sustain states
		if (m_env_state == EG_DECAY || m_env_state == EG_SUSTAIN)
			start_attack(true);

		// phase is reset to 0 in modes 0/4
		if (bitfield(mode, 1) == 0)
			m_phase = 0;
	}

	// in all modes, once we hit release state, attenuation is forced to maximum
	if (m_env_state == EG_RELEASE)
		m_env_attenuation = 0x3ff;
}